

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffc2d(char *cval,double *dval,int *status)

{
  int iVar1;
  char *outstr;
  uint uVar2;
  char dtype;
  char msg [81];
  char sval [81];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffdtyp(cval,&dtype,status);
  switch(dtype) {
  case 'C':
    outstr = sval;
    ffc2s(cval,outstr,status);
    break;
  default:
    *status = 0x196;
    goto LAB_00139352;
  case 'F':
  case 'I':
    outstr = cval;
    break;
  case 'L':
    uVar2 = 0;
    if ((*status < 1) && (*cval == 'T')) {
      uVar2 = 0x3ff00000;
    }
    *dval = (double)((ulong)uVar2 << 0x20);
    goto LAB_00139344;
  }
  ffc2dd(outstr,dval,status);
LAB_00139344:
  iVar1 = *status;
  if (0 < iVar1) {
LAB_00139352:
    *dval = 0.0;
    builtin_strncpy(msg + 0x10,"valuating string as a double: ",0x1f);
    builtin_strncpy(msg,"Error in ffc2d e",0x10);
    strncat(msg,cval,0x1e);
    ffpmsg(msg);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffc2d(const char *cval,   /* I - string representation of the value */
          double *dval,       /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to a double value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    ffdtyp(cval, &dtype, status);     /* determine the datatype */

    if (dtype == 'I' || dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (dtype == 'L')
    {
        ffc2ll(cval, &lval, status);
        *dval = (double) lval;
    }
    else if (dtype == 'C')
    {
        /* try reading the string as a number */
        ffc2s(cval, sval, status); 
        ffc2dd(sval, dval, status);
    }
    else 
        *status = BAD_DOUBLEKEY;

    if (*status > 0)
    {
            *dval = 0.;
            strcpy(msg,"Error in ffc2d evaluating string as a double: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    return(*status);
}